

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::scaleAndAddTo<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
               (Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *dst,
               Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *a_lhs,
               Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *a_rhs,
               Scalar *alpha)

{
  long lVar1;
  XprTypeNested pRVar2;
  long lVar3;
  char *__function;
  BlockingType blocking;
  undefined1 local_98 [16];
  variable_if_dynamic<long,__1> local_88;
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_80;
  variable_if_dynamic<long,__1> local_78;
  variable_if_dynamic<long,__1> vStack_70;
  long local_68;
  XprTypeNested local_60;
  undefined1 local_58 [24];
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_40;
  variable_if_dynamic<long,__1> local_38;
  variable_if_dynamic<long,__1> vStack_30;
  Index local_28;
  
  lVar1 = (dst->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  if ((lVar1 != (a_lhs->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value) ||
     (pRVar2 = (XprTypeNested)
               (dst->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value,
     pRVar2 != (XprTypeNested)
               (a_rhs->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value)) {
    __assert_fail("dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                  ,0x1d6,
                  "static void Eigen::internal::generic_product_impl<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, Eigen::Ref<Eigen::Matrix<double, -1, -1>>>::scaleAndAddTo(Dest &, const Lhs &, const Rhs &, const Scalar &) [Lhs = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, LhsShape = Eigen::DenseShape, RhsShape = Eigen::DenseShape, ProductType = 8, Dest = Eigen::Ref<Eigen::Matrix<double, -1, -1>>]"
                 );
  }
  if (((pRVar2 != (XprTypeNested)0x0) && (lVar1 != 0)) &&
     (lVar3 = (a_lhs->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value, lVar3 != 0)) {
    if (pRVar2 == (XprTypeNested)0x1) {
      local_98._0_8_ =
           (dst->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      lVar3 = (dst->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      local_98._8_8_ = lVar1;
      if (lVar1 < 0 && (PointerType)local_98._0_8_ != (PointerType)0x0) {
        __function = 
        "Eigen::MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Level = 0]"
        ;
      }
      else {
        local_78.m_value = 0;
        vStack_70.m_value = 0;
        local_28 = (a_rhs->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).m_stride.m_outer.m_value;
        local_58._0_8_ =
             (a_rhs->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
        local_58._8_8_ =
             (a_rhs->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value;
        local_68 = lVar3;
        if (-1 < (long)local_58._8_8_ ||
            (Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
            local_58._0_8_ ==
            (Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0) {
          local_38.m_value = 0;
          vStack_30.m_value = 0;
          local_80 = dst;
          local_40 = a_rhs;
          generic_product_impl<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>const,-1,1,true>const,Eigen::DenseShape,Eigen::DenseShape,7>
          ::
          scaleAndAddTo<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>>
                    ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
                      *)local_98,a_lhs,
                     (Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
                      *)local_58,alpha);
          return;
        }
        __function = 
        "Eigen::MapBase<Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Level = 0]"
        ;
        local_80 = dst;
      }
    }
    else {
      if (lVar1 != 1) {
        local_60 = (XprTypeNested)*alpha;
        local_98._0_8_ = (PointerType)0x0;
        local_98._8_8_ = (void *)0x0;
        local_88.m_value = lVar1;
        local_80 = pRVar2;
        local_78.m_value = lVar3;
        evaluateProductBlockingSizesHeuristic<double,double,1,long>
                  (&local_78.m_value,&local_88.m_value,(long *)&local_80,1);
        vStack_70.m_value = local_88.m_value * local_78.m_value;
        local_68 = local_78.m_value * (long)local_80;
        local_40 = local_60;
        local_58._0_8_ = a_lhs;
        local_58._8_8_ = a_rhs;
        local_58._16_8_ = dst;
        local_38.m_value = (long)local_98;
        gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
        ::operator()((gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0,_1>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
                      *)local_58,0,
                     (a_lhs->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                     ).
                     super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                     .
                     super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                     .m_rows.m_value,0,
                     (a_rhs->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                     ).
                     super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                     .
                     super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                     .m_cols.m_value,(GemmParallelInfo<long> *)0x0);
        free((void *)local_98._0_8_);
        free((void *)local_98._8_8_);
        return;
      }
      local_98._0_8_ =
           (dst->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_88.m_value = (long)pRVar2;
      if ((long)pRVar2 < 0 && (PointerType)local_98._0_8_ != (PointerType)0x0) {
        __function = 
        "Eigen::MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>, Level = 0]"
        ;
      }
      else {
        local_78.m_value = 0;
        vStack_70.m_value = 0;
        local_68 = 1;
        local_58._0_8_ =
             (a_lhs->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
        local_58._16_8_ = lVar3;
        if (-1 < lVar3 ||
            (Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
            local_58._0_8_ ==
            (Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)0x0) {
          local_38.m_value = 0;
          vStack_30.m_value = 0;
          local_28 = 1;
          local_80 = dst;
          local_40 = a_lhs;
          generic_product_impl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>const,1,-1,false>const,Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,Eigen::DenseShape,Eigen::DenseShape,7>
          ::
          scaleAndAddTo<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>>
                    ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>
                      *)local_98,
                     (Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>
                      *)local_58,a_rhs,alpha);
          return;
        }
        __function = 
        "Eigen::MapBase<Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>, Level = 0]"
        ;
        local_80 = dst;
      }
    }
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,__function);
  }
  return;
}

Assistant:

static void scaleAndAddTo(Dest& dst, const Lhs& a_lhs, const Rhs& a_rhs, const Scalar& alpha)
  {
    eigen_assert(dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols());
    if(a_lhs.cols()==0 || a_lhs.rows()==0 || a_rhs.cols()==0)
      return;

    if (dst.cols() == 1)
    {
      // Fallback to GEMV if either the lhs or rhs is a runtime vector
      typename Dest::ColXpr dst_vec(dst.col(0));
      return internal::generic_product_impl<Lhs,typename Rhs::ConstColXpr,DenseShape,DenseShape,GemvProduct>
        ::scaleAndAddTo(dst_vec, a_lhs, a_rhs.col(0), alpha);
    }
    else if (dst.rows() == 1)
    {
      // Fallback to GEMV if either the lhs or rhs is a runtime vector
      typename Dest::RowXpr dst_vec(dst.row(0));
      return internal::generic_product_impl<typename Lhs::ConstRowXpr,Rhs,DenseShape,DenseShape,GemvProduct>
        ::scaleAndAddTo(dst_vec, a_lhs.row(0), a_rhs, alpha);
    }

    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    Scalar actualAlpha = combine_scalar_factors(alpha, a_lhs, a_rhs);

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
            Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

    typedef internal::gemm_functor<
      Scalar, Index,
      internal::general_matrix_matrix_product<
        Index,
        LhsScalar, (ActualLhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
        RhsScalar, (ActualRhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
        (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,
        Dest::InnerStrideAtCompileTime>,
      ActualLhsTypeCleaned, ActualRhsTypeCleaned, Dest, BlockingType> GemmFunctor;

    BlockingType blocking(dst.rows(), dst.cols(), lhs.cols(), 1, true);
    internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>
        (GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), a_lhs.rows(), a_rhs.cols(), a_lhs.cols(), Dest::Flags&RowMajorBit);
  }